

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::DividedByEqual<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,
              View<int,_false,_std::allocator<unsigned_long>_> *w,int *param_3,int *param_4)

{
  size_t sVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  int *local_40;
  int *local_38;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  if (sVar1 != 0) {
    uVar4 = 0;
    local_40 = param_3;
    local_38 = param_4;
    do {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar1 != 0) {
        uVar2 = 0;
        piVar3 = local_40;
        piVar5 = local_38;
        do {
          *piVar3 = *piVar3 / *piVar5;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar3 = piVar3 + sVar1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(w,0);
          piVar5 = piVar5 + sVar1;
          uVar2 = uVar2 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar2 < sVar1);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::shape(w,0);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(w,0);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
      local_40 = local_40 + sVar1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(w,1);
      local_38 = local_38 + sVar1;
      uVar4 = uVar4 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
    } while (uVar4 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
  View<int,_false,_std::allocator<unsigned_long>_>::shape(w,1);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(w,1);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A1>& v, 
        const View<T2, isConst, A2>& w, 
        Functor f, 
        T1* data1,
        const T2* data2
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinary<N-1, Functor, T1, T2, isConst, A1, A2>::operate(
                v, w, f, data1, data2);
            data1 += v.strides(N-1);
            data2 += w.strides(N-1);
        }
        data1 -= v.shape(N-1) * v.strides(N-1);
        data2 -= w.shape(N-1) * w.strides(N-1);
    }